

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void bust_a_prompt(CHAR_DATA *ch)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  undefined8 *puVar4;
  ROOM_INDEX_DATA *pRVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  short *psVar14;
  short *psVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  DESCRIPTOR_DATA *pDVar20;
  char *pcVar21;
  char *pcVar22;
  char buf2 [4608];
  char buf [4608];
  char doors [4608];
  char buf3 [4608];
  short local_4838;
  undefined1 local_4836;
  char local_3638 [4];
  undefined1 auStack_3634 [4604];
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar6 = is_npc(ch);
  if ((((bVar6) || (bVar6 = str_cmp(ch->prompt,""), !bVar6)) ||
      (bVar6 = str_cmp(ch->prompt,"<%hhp %mm %vmv> "), !bVar6)) ||
     (bVar6 = str_cmp(ch->prompt,"<%hhp %mm %vmv>"), !bVar6)) {
    pcVar22 = get_char_color(ch,"prompt");
    uVar17 = ch->hit;
    sVar2 = ch->mana;
    sVar3 = ch->move;
    pcVar11 = END_COLOR(ch);
    sprintf(local_3638,"%s<%dhp %dm %dmv>%s ",pcVar22,(ulong)uVar17,(ulong)(uint)(int)sVar2,
            (ulong)(uint)(int)sVar3,pcVar11);
    send_to_char(local_3638,ch);
    return;
  }
  if ((ch->comm[0] & 0x2000000) != 0) {
    send_to_char("<AFK> ",ch);
  }
  pcVar11 = get_char_color(ch,"prompt");
  pcVar22 = ch->prompt;
  pcVar12 = END_COLOR(ch);
  sprintf((char *)&local_4838,"%s%s%s",pcVar11,pcVar22,pcVar12);
  pcVar22 = local_1238;
  strcpy(pcVar22,(char *)&local_4838);
  pcVar11 = local_3638;
  iVar9 = (int)pcVar11;
  psVar14 = (short *)0x0;
  do {
    iVar16 = (int)pcVar11 - iVar9;
    pcVar22 = pcVar22 + 2;
    while( true ) {
      cVar8 = pcVar22[-2];
      if (cVar8 == '\0') {
        write_to_buffer(ch->desc,local_3638,iVar16);
        return;
      }
      if (cVar8 == '%') break;
      *pcVar11 = cVar8;
      pcVar11 = pcVar11 + 1;
      iVar16 = iVar16 + 1;
      pcVar22 = pcVar22 + 1;
    }
    bVar1 = pcVar22[-1];
    if (bVar1 < 0x33) {
      if (bVar1 == 0x25) {
        pcVar12 = "%%";
      }
      else {
        if (bVar1 == 0x31) {
          iVar16 = (int)ch->max_hit;
          if (iVar16 != 0) {
            iVar10 = ch->hit;
            goto LAB_0027ea6d;
          }
        }
        else {
          psVar15 = (short *)0x38312b;
          if (bVar1 != 0x32) goto switchD_0027e50e_caseD_49;
          iVar16 = (int)ch->max_mana;
          if (iVar16 != 0) {
            sVar2 = ch->mana;
            goto LAB_0027ea6a;
          }
        }
LAB_0027ea8c:
        pcVar12 = "0%%";
      }
      sprintf((char *)&local_4838,pcVar12);
      goto LAB_0027ea9d;
    }
    psVar15 = (short *)0x38312b;
    switch(bVar1) {
    case 0x48:
      uVar18 = (ulong)(uint)(int)ch->max_hit;
      break;
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4e:
    case 0x4f:
    case 0x51:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x57:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x62:
    case 100:
    case 0x66:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6e:
    case 0x73:
    case 0x75:
    case 0x77:
    case 0x79:
      goto switchD_0027e50e_caseD_49;
    case 0x4c:
      local_4838 = (ushort)(ch->wait < 2) * 2 + 0x2b;
      goto LAB_0027ea9d;
    case 0x4d:
      uVar18 = (ulong)(uint)(int)ch->max_mana;
      break;
    case 0x50:
      bVar6 = is_immortal(ch);
      if ((bVar6) && (ch->in_room != (ROOM_INDEX_DATA *)0x0)) {
        uVar18 = 0;
        for (pDVar20 = descriptor_list; pDVar20 != (DESCRIPTOR_DATA *)0x0; pDVar20 = pDVar20->next)
        {
          if (pDVar20->connected == 0) {
            pRVar5 = pDVar20->character->in_room;
            if ((pRVar5 != (ROOM_INDEX_DATA *)0x0) && (pRVar5->area == ch->in_room->area)) {
              bVar6 = can_see(ch,pDVar20->character);
              uVar18 = (ulong)((int)uVar18 + (uint)bVar6);
            }
          }
        }
        goto LAB_0027e874;
      }
LAB_0027ea4f:
      local_4838 = 0x20;
      goto LAB_0027ea9d;
    case 0x52:
      bVar6 = is_immortal(ch);
      if ((!bVar6) || (ch->in_room == (ROOM_INDEX_DATA *)0x0)) goto LAB_0027ea4f;
      uVar18 = (ulong)(uint)(int)ch->in_room->vnum;
      break;
    case 0x56:
      uVar18 = (ulong)(uint)(int)ch->max_move;
      break;
    case 0x58:
      bVar6 = is_npc(ch);
      uVar18 = 0;
      if (!bVar6) {
        sVar2 = ch->level;
        iVar16 = exp_per_level(ch);
        uVar18 = (ulong)(uint)(iVar16 * sVar2 - ch->exp);
      }
      break;
    case 0x61:
      bVar6 = is_good(ch);
      pcVar12 = "good";
      if (!bVar6) {
        bVar6 = is_evil(ch);
        pcVar12 = "neutral";
        if (bVar6) {
          pcVar12 = "evil";
        }
      }
      goto LAB_0027ea48;
    case 99:
      local_4836 = 0;
      local_4838 = 0xd0a;
      goto LAB_0027ea9d;
    case 0x65:
      local_2438[0] = '\0';
      lVar19 = 0;
      bVar6 = false;
      do {
        puVar4 = *(undefined8 **)((long)ch->in_room->exit + lVar19 * 2);
        if ((((puVar4 != (undefined8 *)0x0) &&
             ((ROOM_INDEX_DATA *)*puVar4 != (ROOM_INDEX_DATA *)0x0)) &&
            (bVar7 = can_see_room(ch,(ROOM_INDEX_DATA *)*puVar4), bVar7)) &&
           ((((uint)puVar4[1] >> 8 & 1) == 0 &&
            (((puVar4[1] & 2) == 0 || (bVar7 = is_immortal(ch), bVar7)))))) {
          strcat(local_2438,
                 (char *)((long)&DAT_003954b4 + (long)*(int *)((long)&DAT_003954b4 + lVar19)));
          bVar6 = true;
        }
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x18);
      if ((!bVar6) || ((bVar6 = is_affected_by(ch,0), bVar6 && (bVar6 = is_immortal(ch), !bVar6))))
      {
        sVar13 = strlen(local_3638);
        builtin_strncpy(local_3638 + sVar13,"none",4);
        auStack_3634[sVar13] = 0;
      }
      pcVar12 = local_2438;
      goto LAB_0027ea48;
    case 0x67:
      sprintf((char *)&local_4838,"%ld",ch->gold);
      goto LAB_0027ea9d;
    case 0x68:
      uVar18 = (ulong)(uint)ch->hit;
      break;
    case 0x6d:
      uVar18 = (ulong)(uint)(int)ch->mana;
      break;
    case 0x6f:
      bVar6 = is_editing(ch);
      psVar15 = psVar14;
      if (bVar6) {
        pcVar12 = olc_ed_name(ch);
        pcVar21 = olc_ed_vnum(ch);
        sprintf((char *)&local_4838," (%s - %s)",pcVar12,pcVar21);
        goto LAB_0027ea9d;
      }
      goto switchD_0027e50e_caseD_49;
    case 0x70:
      bVar6 = is_immortal(ch);
      if ((!bVar6) || (ch->in_room == (ROOM_INDEX_DATA *)0x0)) goto LAB_0027ea4f;
      uVar18 = 0;
      for (pDVar20 = descriptor_list; pDVar20 != (DESCRIPTOR_DATA *)0x0; pDVar20 = pDVar20->next) {
        if (pDVar20->connected == 0) {
          pRVar5 = pDVar20->character->in_room;
          if ((pRVar5 != (ROOM_INDEX_DATA *)0x0) && (pRVar5->area == ch->in_room->area)) {
            bVar6 = is_immortal(pDVar20->character);
            uVar18 = (ulong)((int)uVar18 + (uint)!bVar6);
          }
        }
      }
LAB_0027e874:
      pcVar12 = "%i";
      goto LAB_0027e99d;
    case 0x71:
      uVar18 = (ulong)(uint)(int)ch->pcdata->write_next;
      break;
    case 0x72:
      if (ch->in_room == (ROOM_INDEX_DATA *)0x0) goto LAB_0027ea4f;
      bVar6 = is_npc(ch);
      if ((bVar6) || ((ch->act[0] & 0x2000) == 0)) {
        bVar6 = is_affected_by(ch,0);
        pcVar12 = "darkness";
        if (!bVar6) {
          bVar6 = room_is_dark(ch->in_room);
          pcVar12 = "darkness";
          if (!bVar6) goto LAB_0027ea36;
        }
      }
      else {
LAB_0027ea36:
        pcVar12 = get_room_name(ch->in_room);
      }
      goto LAB_0027ea48;
    case 0x74:
      uVar17 = time_info.hour +
               (((uint)(time_info.hour / 6 + (time_info.hour >> 0x1f)) >> 1) -
               (time_info.hour >> 0x1f)) * -0xc;
      if (uVar17 == 0) {
        uVar17 = 0xc;
      }
      pcVar12 = "";
      if (time_info.half != false) {
        pcVar12 = ":30";
      }
      pcVar21 = "am";
      if (0xb < time_info.hour) {
        pcVar21 = "pm";
      }
      sprintf((char *)&local_4838,"%d%s %s",(ulong)uVar17,pcVar12,pcVar21);
      goto LAB_0027ea9d;
    case 0x76:
      uVar18 = (ulong)(uint)(int)ch->move;
      break;
    case 0x78:
      uVar18 = (ulong)(uint)ch->exp;
      break;
    case 0x7a:
      bVar6 = is_immortal(ch);
      if ((!bVar6) || (ch->in_room == (ROOM_INDEX_DATA *)0x0)) goto LAB_0027ea4f;
      pcVar12 = ch->in_room->area->name;
LAB_0027ea48:
      strcpy((char *)&local_4838,pcVar12);
      goto LAB_0027ea9d;
    default:
      if (bVar1 == 0x33) {
        iVar16 = (int)ch->max_move;
        if (iVar16 == 0) goto LAB_0027ea8c;
        sVar2 = ch->move;
LAB_0027ea6a:
        iVar10 = (int)sVar2;
LAB_0027ea6d:
        sprintf((char *)&local_4838,"%d%s",(ulong)(uint)((iVar10 * 100) / iVar16),"%");
        goto LAB_0027ea9d;
      }
      psVar15 = (short *)0x38312b;
      if (bVar1 == 0x43) {
        bVar6 = is_immortal(ch);
        if (!bVar6) goto LAB_0027ea4f;
        uVar18 = 0;
        for (pDVar20 = descriptor_list; pDVar20 != (DESCRIPTOR_DATA *)0x0; pDVar20 = pDVar20->next)
        {
          if (pDVar20->connected == 0) {
            bVar6 = can_see(ch,pDVar20->character);
            uVar18 = (ulong)((int)uVar18 + (uint)bVar6);
          }
        }
        goto LAB_0027e874;
      }
      goto switchD_0027e50e_caseD_49;
    }
    pcVar12 = "%d";
LAB_0027e99d:
    sprintf((char *)&local_4838,pcVar12,uVar18);
LAB_0027ea9d:
    psVar15 = &local_4838;
switchD_0027e50e_caseD_49:
    cVar8 = (char)*psVar15;
    *pcVar11 = cVar8;
    while (psVar14 = psVar15, cVar8 != '\0') {
      cVar8 = *(char *)((long)psVar15 + 1);
      psVar15 = (short *)((long)psVar15 + 1);
      pcVar11[1] = cVar8;
      pcVar11 = pcVar11 + 1;
    }
  } while( true );
}

Assistant:

void bust_a_prompt(CHAR_DATA *ch)
{
	char buf[MAX_STRING_LENGTH];
	char buf2[MAX_STRING_LENGTH], buf3[MSL];
	/*const*/ char *str, *orig;
	const char *i = nullptr;
	char *point;
	char doors[MAX_INPUT_LENGTH];
	EXIT_DATA *pexit;
	int number_people;
	bool found;
	const char *dir_name[] = {"N", "E", "S", "W", "U", "D"};
	int door;
	DESCRIPTOR_DATA *d;
	point = buf;

	if (is_npc(ch)
		|| !str_cmp(ch->prompt, "")
		|| !str_cmp(ch->prompt, "<%hhp %mm %vmv> ")
		|| !str_cmp(ch->prompt, "<%hhp %mm %vmv>"))
	{
		sprintf(buf, "%s<%dhp %dm %dmv>%s ", get_char_color(ch, "prompt"), ch->hit, ch->mana, ch->move, END_COLOR(ch));
		send_to_char(buf, ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_AFK))
		send_to_char("<AFK> ", ch);

	sprintf(buf2, "%s%s%s", get_char_color(ch, "prompt"), ch->prompt, END_COLOR(ch));
	strcpy(&buf3[0], &buf2[0]);
	orig = &buf3[0];
	str = orig;

	while (*str != '\0')
	{
		if (*str != '%')
		{
			*point++ = *str++;
			continue;
		}

		++str;

		switch (*str)
		{
			case 'e':
				found= false;
				doors[0] = '\0';

				for (door = 0; door < 6; door++)
				{
					if ((pexit = ch->in_room->exit[door]) != nullptr
						&& pexit->u1.to_room != nullptr
						&& can_see_room(ch, pexit->u1.to_room)
						&& !IS_SET(pexit->exit_info, EX_NONOBVIOUS)
						&& (!IS_SET(pexit->exit_info, EX_CLOSED) || is_immortal(ch)))
					{
						found = true;
						strcat(doors, dir_name[door]);
					}
				}

				if (!found || (is_affected_by(ch, AFF_BLIND) && !is_immortal(ch)))
					strcat(buf, "none");

				sprintf(buf2, "%s", doors);
				i = buf2;
				break;
			case 'c':
				sprintf(buf2, "%s", "\n\r");
				i = buf2;
				break;
			case 'h':
				if (!IS_SET(ch->comm, COMM_ANSI))
					sprintf(buf2, "%d", ch->hit);
				else
					sprintf(buf2, "%d", ch->hit);

				i = buf2;
				break;
			case 'H':
				sprintf(buf2, "%d", ch->max_hit);
				i = buf2;
				break;
			case 'm':
				sprintf(buf2, "%d", ch->mana);
				i = buf2;
				break;
			case 'M':
				sprintf(buf2, "%d", ch->max_mana);
				i = buf2;
				break;
			case 'L':
				if (ch->wait > 1)
					sprintf(buf2, "+");
				else
					sprintf(buf2, "-");

				i = buf2;
				break;
			case 'v':
				sprintf(buf2, "%d", ch->move);
				i = buf2;
				break;
			case 'V':
				sprintf(buf2, "%d", ch->max_move);
				i = buf2;
				break;
			case '1':
				if (ch->max_hit == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->hit) / ch->max_hit, "%");

				i = buf2;
				break;
			case '2':
				if (ch->max_mana == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->mana) / ch->max_mana, "%");

				i = buf2;
				break;
			case '3':
				if (ch->max_move == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->move) / ch->max_move, "%");

				i = buf2;
				break;
			case 'x':
				sprintf(buf2, "%d", ch->exp);
				i = buf2;
				break;
			case 'X':
				sprintf(buf2, "%d", is_npc(ch) ? 0 : ch->level * exp_per_level(ch) - ch->exp);
				i = buf2;
				break;
			case 'g':
				sprintf(buf2, "%ld", ch->gold);
				i = buf2;
				break;
			case 'a':
				sprintf(buf2, "%s", is_good(ch) ? "good" : is_evil(ch) ? "evil" : "neutral");
				i = buf2;
				break;
			case 'r':
				if (ch->in_room != nullptr)
				{
					sprintf(buf2, "%s",
						((!is_npc(ch) && IS_SET(ch->act, PLR_HOLYLIGHT))
							|| (!is_affected_by(ch, AFF_BLIND) && !room_is_dark(ch->in_room)))
								? get_room_name(ch->in_room)
								: "darkness");
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'R':
				if (is_immortal(ch) && ch->in_room != nullptr)
					sprintf(buf2, "%d", ch->in_room->vnum);
				else
					sprintf(buf2, " ");

				i = buf2;
				break;
			case 'z':
				if (is_immortal(ch) && ch->in_room != nullptr)
					sprintf(buf2, "%s", ch->in_room->area->name);
				else
					sprintf(buf2, " ");

				i = buf2;
				break;
			case 'p':
				if (is_immortal(ch) && ch->in_room != nullptr)
				{
					number_people = 0;

					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING
							&& d->character->in_room != nullptr
							&& d->character->in_room->area == ch->in_room->area
							&& !is_immortal(d->character))
						{
							number_people++;
						}
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'P':
				if (is_immortal(ch) && ch->in_room != nullptr)
				{
					number_people = 0;
					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING
							&& d->character->in_room != nullptr
							&& d->character->in_room->area == ch->in_room->area
							&& can_see(ch, d->character))
						{
							number_people++;
						}
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'C':
				if (is_immortal(ch))
				{
					number_people = 0;

					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING && can_see(ch, d->character))
							number_people++;
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case '%':
				sprintf(buf2, "%%");
				i = buf2;
				break;
			case 'o':
				if (is_editing(ch))
				{
					sprintf(buf2, " (%s - %s)", olc_ed_name(ch), olc_ed_vnum(ch));
					i = buf2;
				}
				break;
			case 't':
				sprintf(buf2, "%d%s %s",
					(time_info.hour % 12 == 0) ? 12 : time_info.hour % 12,
					time_info.half ? ":30" : "",
					(time_info.hour >= 12) ? "pm" : "am");

				i = buf2;
				break;
			case 'q':
				sprintf(buf2, "%d", ch->pcdata->write_next);
				i = buf2;
				break;
			default:
				i = " ";
				break;
		}

		++str;

		while ((*point = *i) != '\0')
		{
			++point, ++i;
		}
	}

	write_to_buffer(ch->desc, buf, point - buf);
	//   free_pstring(orig);
}